

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  ArrayPtr<const_char> *pAVar1;
  char cVar2;
  _Base_ptr p_Var3;
  Iface *pIVar4;
  uint *puVar5;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr programName_20;
  ushort *__s;
  char **ppcVar6;
  MainImpl *this_00;
  ArrayDisposer *pAVar7;
  long *plVar8;
  StringPtr *pSVar9;
  RemoveConst<kj::StringPtr> *pRVar10;
  StringPtr *pSVar11;
  Arg *argSpec;
  void *pvVar12;
  iterator iVar13;
  Arg *pAVar14;
  iterator iVar15;
  ushort uVar16;
  Arg *pAVar17;
  Arg *pAVar18;
  _Rb_tree_header *p_Var19;
  Impl *pIVar20;
  Arg *pAVar21;
  undefined8 uVar22;
  Arg *pAVar23;
  size_t __n;
  size_t sVar24;
  char *pcVar25;
  ProcessContext *pPVar26;
  Arg *pAVar27;
  uint uVar28;
  String *params_3;
  uint uVar29;
  uint uVar30;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *__src;
  long lVar31;
  kj *this_01;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr message_08;
  StringPtr message_09;
  StringPtr message_10;
  StringPtr message_11;
  StringPtr message_12;
  StringPtr message_13;
  StringPtr message_14;
  StringPtr message_15;
  StringPtr message_16;
  StringPtr message_17;
  char c;
  StringPtr param;
  StringPtr arg;
  Vector<kj::StringPtr> arguments;
  StringPtr dummyArg;
  String *in_stack_fffffffffffffec8;
  String *in_stack_fffffffffffffed0;
  String local_128;
  undefined8 *local_110;
  char *local_100;
  size_t local_f8;
  MainImpl *local_f0;
  String local_e8;
  undefined8 *local_d0;
  Arg *local_c8;
  char local_c0;
  undefined7 uStack_bf;
  long *local_b8;
  Arg *local_b0;
  key_type local_a8;
  undefined1 local_89 [9];
  size_t sStack_80;
  Vector<kj::StringPtr> local_78;
  long local_50;
  Arg *local_48;
  ArrayPtr<const_char> local_40;
  
  pAVar27 = (Arg *)params.size_;
  pAVar17 = (Arg *)params.ptr;
  local_f8 = programName.content.size_;
  local_100 = programName.content.ptr;
  local_78.builder.ptr = (StringPtr *)0x0;
  local_78.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_78.builder.endPtr = (StringPtr *)0x0;
  local_78.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_f0 = this;
  local_c8 = pAVar17;
  if (pAVar27 != (Arg *)0x0) {
    pAVar23 = (Arg *)0x0;
    pAVar18 = pAVar27;
    local_b0 = pAVar27;
    do {
      this = local_f0;
      pAVar1 = &(local_c8->title).content + (long)pAVar23;
      local_a8.content.ptr._0_4_ = *(undefined4 *)&pAVar1->ptr;
      local_a8.content.ptr._4_4_ = *(undefined4 *)((long)&pAVar1->ptr + 4);
      __s = (ushort *)pAVar1->ptr;
      local_a8.content.size_._0_4_ = (undefined4)pAVar1->size_;
      local_a8.content.size_._4_4_ = *(undefined4 *)((long)&pAVar1->size_ + 4);
      sVar24 = pAVar1->size_;
      if (sVar24 == 3) {
        uVar16 = (ushort)(byte)__s[1] | *__s ^ 0x2d2d;
        pAVar17 = (Arg *)(ulong)uVar16;
        pAVar21 = (Arg *)0x2;
        if (uVar16 == 0) {
          __src = &local_c8->callback + (long)pAVar23;
          pAVar1 = &(local_c8->title).content;
          __n = (long)(pAVar1 + (long)pAVar18) - (long)__src;
          pAVar17 = (Arg *)(((long)__n >> 4) +
                           ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 4));
          if ((Arg *)((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 4) < pAVar17) {
            pAVar23 = (Arg *)0x4;
            if (local_78.builder.endPtr != local_78.builder.ptr) {
              pAVar23 = (Arg *)((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3);
            }
            if (pAVar23 < pAVar17) {
              pAVar23 = pAVar17;
            }
            Vector<kj::StringPtr>::setCapacity(&local_78,(size_t)pAVar23);
          }
          pRVar10 = local_78.builder.pos;
          if (pAVar1 + (long)pAVar18 != (ArrayPtr<const_char> *)__src) {
            memcpy(local_78.builder.pos,__src,__n);
          }
          local_78.builder.pos = (RemoveConst<kj::StringPtr> *)((long)pRVar10 + __n);
          this = local_f0;
          break;
        }
LAB_001dec9f:
        if (*__s == 0x2d2d) {
          local_89._1_8_ = (char *)0x0;
          sStack_80 = 0;
          pvVar12 = memchr(__s,0x3d,(size_t)pAVar21);
          this = local_f0;
          if (pvVar12 == (void *)0x0) {
            sStack_80 = sVar24 - 3;
          }
          else {
            sStack_80 = ((long)pvVar12 - (long)__s) - 2;
            local_50 = (long)pvVar12 + 1;
            local_48 = (Arg *)(~((long)pvVar12 - (long)__s) + sVar24);
          }
          local_89._1_8_ = __s + 1;
          iVar13 = std::
                   _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_std::less<kj::ArrayPtr<const_char>_>,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
                   ::find(&(((local_f0->impl).ptr)->longOptions)._M_t,(key_type *)(local_89 + 1));
          pAVar17 = (Arg *)&(((this->impl).ptr)->longOptions)._M_t._M_impl.super__Rb_tree_header;
          if ((Arg *)iVar13._M_node == pAVar17) {
            if ((CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) == 7) &&
               (*(int *)((long)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) + 3)
                == 0x706c65 &&
                *(int *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) ==
                0x65682d2d)) {
              programName_05.content.size_ = local_f8;
              programName_05.content.ptr = local_100;
              printHelp(local_f0,programName_05);
            }
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                      (&local_128,(kj *)"--",(char (*) [3])(local_89 + 1),
                       (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pAVar27);
            pcVar25 = local_128.content.ptr;
            if (local_128.content.size_ == 0) {
              pcVar25 = "";
            }
            message_05.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
            programName_07.content.size_ = local_f8;
            programName_07.content.ptr = local_100;
            message_05.content.ptr = pcVar25;
            usageError(local_f0,programName_07,message_05);
          }
          p_Var3 = iVar13._M_node[1]._M_left;
          if (*(char *)&p_Var3->_M_left == '\x01') {
            if (pvVar12 == (void *)0x0) {
              ppcVar6 = &(pAVar23->title).content.ptr;
              pAVar23 = (Arg *)((long)ppcVar6 + 1);
              if (pAVar18 <= pAVar23) {
LAB_001dfa87:
                str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                          (&local_128,(kj *)"--",(char (*) [3])(local_89 + 1),
                           (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pAVar27);
                pcVar25 = local_128.content.ptr;
                if (local_128.content.size_ == 0) {
                  pcVar25 = "";
                }
                message_11.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
                programName_13.content.size_ = local_f8;
                programName_13.content.ptr = local_100;
                message_11.content.ptr = pcVar25;
                usageError(local_f0,programName_13,message_11);
              }
              pAVar17 = (Arg *)(&local_c8->callback)[(long)ppcVar6].impl.ptr;
              if (((pAVar17 != (Arg *)0x1) && (pAVar17 != (Arg *)0x2)) &&
                 (*(char *)&((&local_c8->callback)[(long)ppcVar6].impl.disposer)->_vptr_Disposer ==
                  '-')) goto LAB_001dfa87;
              (*(code *)**(undefined8 **)p_Var3->_M_right->_M_parent)(&local_e8);
              pAVar21 = (Arg *)local_e8.content.disposer;
              sVar24 = local_e8.content.size_;
              if (local_e8.content.ptr._0_1_ != (_)0x0) {
                local_128.content.size_ = local_e8.content.size_;
                local_128.content.disposer = local_e8.content.disposer;
                local_110 = local_d0;
                local_128.content.ptr =
                     (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
                str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                          (&local_e8,(kj *)&local_a8,(StringPtr *)"=",
                           (char (*) [2])(&local_c8->callback + (long)ppcVar6),(StringPtr *)0x2026bc
                           ,(char (*) [3])&local_128.content.size_,in_stack_fffffffffffffec8);
                if ((char *)local_e8.content.size_ == (char *)0x0) {
                  local_e8.content.ptr = "";
                }
                message_15.content.size_ =
                     (char *)(local_e8.content.size_ +
                             ((char *)local_e8.content.size_ == (char *)0x0));
                programName_17.content.size_ = local_f8;
                programName_17.content.ptr = local_100;
                message_15.content.ptr = local_e8.content.ptr;
                usageError(local_f0,programName_17,message_15);
              }
              local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
              pAVar18 = local_b0;
              if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
                 ((char *)local_e8.content.size_ != (char *)0x0)) {
                local_e8.content.size_ = 0;
                local_e8.content.disposer = (ArrayDisposer *)0x0;
                pAVar27 = pAVar21;
                (**(code **)*local_d0)(local_d0,sVar24,1);
                pAVar17 = pAVar21;
                pAVar18 = local_b0;
              }
            }
            else {
              p_Var3 = p_Var3->_M_right->_M_parent;
              pAVar17 = local_48;
              (*(code *)**(undefined8 **)p_Var3)(&local_e8,p_Var3,local_50);
              pAVar21 = (Arg *)local_e8.content.disposer;
              sVar24 = local_e8.content.size_;
              if (local_e8.content.ptr._0_1_ != (_)0x0) {
                local_128.content.size_ = local_e8.content.size_;
                local_128.content.disposer = local_e8.content.disposer;
                local_110 = local_d0;
                local_128.content.ptr =
                     (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
                str<kj::StringPtr&,char_const(&)[3],kj::String&>
                          (&local_e8,(kj *)&local_a8,(StringPtr *)0x2026bc,
                           (char (*) [3])&local_128.content.size_,(String *)pAVar27);
                if ((char *)local_e8.content.size_ == (char *)0x0) {
                  local_e8.content.ptr = "";
                }
                message_10.content.size_ =
                     (char *)(local_e8.content.size_ +
                             ((char *)local_e8.content.size_ == (char *)0x0));
                programName_12.content.size_ = local_f8;
                programName_12.content.ptr = local_100;
                message_10.content.ptr = local_e8.content.ptr;
                usageError(local_f0,programName_12,message_10);
              }
              local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
              if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
                 ((char *)local_e8.content.size_ != (char *)0x0)) {
                local_e8.content.size_ = 0;
                local_e8.content.disposer = (ArrayDisposer *)0x0;
                pAVar27 = pAVar21;
                (**(code **)*local_d0)(local_d0,sVar24,1);
                pAVar17 = pAVar21;
              }
            }
          }
          else {
            if (pvVar12 != (void *)0x0) {
              str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                        (&local_128,(kj *)"--",(char (*) [3])(local_89 + 1),
                         (ArrayPtr<const_char> *)": option does not accept an argument",
                         (char (*) [37])pAVar27);
              pcVar25 = local_128.content.ptr;
              if (local_128.content.size_ == 0) {
                pcVar25 = "";
              }
              message_07.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_09.content.size_ = local_f8;
              programName_09.content.ptr = local_100;
              message_07.content.ptr = pcVar25;
              usageError(local_f0,programName_09,message_07);
            }
            (*(code *)**(undefined8 **)p_Var3->_M_right->_M_parent)(&local_e8);
            pAVar21 = (Arg *)local_e8.content.disposer;
            sVar24 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ != (_)0x0) {
              local_128.content.size_ = local_e8.content.size_;
              local_128.content.disposer = local_e8.content.disposer;
              local_110 = local_d0;
              local_128.content.ptr =
                   (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        (&local_e8,(kj *)&local_a8,(StringPtr *)0x2026bc,
                         (char (*) [3])&local_128.content.size_,(String *)pAVar27);
              if ((char *)local_e8.content.size_ == (char *)0x0) {
                local_e8.content.ptr = "";
              }
              message_08.content.size_ =
                   (char *)(local_e8.content.size_ + ((char *)local_e8.content.size_ == (char *)0x0)
                           );
              programName_10.content.size_ = local_f8;
              programName_10.content.ptr = local_100;
              message_08.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_10,message_08);
            }
            local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
            if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
               ((char *)local_e8.content.size_ != (char *)0x0)) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              pAVar27 = pAVar21;
              (**(code **)*local_d0)(local_d0,sVar24,1,pAVar21,pAVar21,0);
              pAVar17 = pAVar21;
            }
          }
        }
        else {
          if ((char)*__s != '-') goto LAB_001ded99;
          pAVar17 = (Arg *)0x1;
          do {
            local_c0 = *(char *)((long)&(pAVar17->title).content.ptr +
                                CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_));
            pIVar20 = (this->impl).ptr;
            pAVar27 = (Arg *)(pIVar20->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent;
            pAVar18 = pAVar27;
            if (pAVar27 == (Arg *)0x0) {
LAB_001df79c:
              str<char_const(&)[2],char&,char_const(&)[22]>
                        (&local_128,(kj *)0x229d2c,(char (*) [2])&local_c0,": unrecognized option",
                         (char (*) [22])pAVar18);
              pcVar25 = local_128.content.ptr;
              if (local_128.content.size_ == 0) {
                pcVar25 = "";
              }
              message_01.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_02.content.size_ = local_f8;
              programName_02.content.ptr = local_100;
              message_01.content.ptr = pcVar25;
              usageError(local_f0,programName_02,message_01);
            }
            p_Var19 = &(pIVar20->shortOptions)._M_t._M_impl.super__Rb_tree_header;
            pAVar14 = (Arg *)p_Var19;
            do {
              cVar2 = (char)pAVar27->minCount;
              params_3 = (String *)(ulong)(cVar2 < local_c0);
              if (local_c0 <= cVar2) {
                pAVar14 = pAVar27;
              }
              pAVar27 = (Arg *)(&(pAVar27->callback).impl.disposer)[(long)params_3];
            } while (pAVar27 != (Arg *)0x0);
            pAVar18 = (Arg *)0x0;
            if ((pAVar14 == (Arg *)p_Var19) || (local_c0 < (char)pAVar14->minCount))
            goto LAB_001df79c;
            pcVar25 = pAVar14[1].title.content.ptr;
            if (pcVar25[0x10] == '\x01') {
              pAVar17 = (Arg *)(ulong)((int)pAVar17 + 1);
              if (pAVar17 < pAVar21) {
                local_89._1_8_ =
                     (long)&(pAVar17->title).content.ptr +
                     CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_);
                pAVar17 = (Arg *)(sVar24 - (long)pAVar17);
                pAVar27 = (Arg *)**(ulong **)(*(long *)(pcVar25 + 0x18) + 8);
                sStack_80 = (size_t)pAVar17;
                (*(code *)(pAVar27->title).content.ptr)
                          (&local_e8,*(ulong **)(*(long *)(pcVar25 + 0x18) + 8),local_89._1_8_);
                pAVar18 = local_b0;
                pAVar21 = (Arg *)local_e8.content.disposer;
                sVar24 = local_e8.content.size_;
                if (local_e8.content.ptr._0_1_ != (_)0x0) {
                  local_128.content.size_ = local_e8.content.size_;
                  local_128.content.disposer = local_e8.content.disposer;
                  local_110 = local_d0;
                  local_128.content.ptr =
                       (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
                  str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                            (&local_e8,(kj *)0x229d2c,(char (*) [2])&local_c0," ",
                             (char (*) [2])(local_89 + 1),(StringPtr *)0x2026bc,
                             (char (*) [3])&local_128.content.size_,in_stack_fffffffffffffed0);
                  if ((char *)local_e8.content.size_ == (char *)0x0) {
                    local_e8.content.ptr = "";
                  }
                  message_14.content.size_ =
                       (char *)(local_e8.content.size_ +
                               ((char *)local_e8.content.size_ == (char *)0x0));
                  programName_16.content.size_ = local_f8;
                  programName_16.content.ptr = local_100;
                  message_14.content.ptr = local_e8.content.ptr;
                  usageError(local_f0,programName_16,message_14);
                }
                local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
                if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
                   ((char *)local_e8.content.size_ != (char *)0x0)) {
                  local_e8.content.size_ = 0;
                  local_e8.content.disposer = (ArrayDisposer *)0x0;
                  pAVar27 = pAVar21;
                  (**(code **)*local_d0)(local_d0,sVar24,1);
                  pAVar17 = pAVar21;
                }
                break;
              }
              ppcVar6 = &(pAVar23->title).content.ptr;
              pAVar23 = (Arg *)((long)ppcVar6 + 1);
              if (pAVar23 < local_b0) {
                pAVar17 = (Arg *)(&local_c8->callback)[(long)ppcVar6].impl.ptr;
                if (((pAVar17 == (Arg *)0x1) || (pAVar17 == (Arg *)0x2)) ||
                   (*(char *)&((&local_c8->callback)[(long)ppcVar6].impl.disposer)->_vptr_Disposer
                    != '-')) {
                  (**(code **)**(undefined8 **)(*(long *)(pcVar25 + 0x18) + 8))(&local_e8);
                  pAVar21 = (Arg *)local_e8.content.disposer;
                  sVar24 = local_e8.content.size_;
                  if (local_e8.content.ptr._0_1_ != (_)0x0) {
                    local_128.content.size_ = local_e8.content.size_;
                    local_128.content.disposer = local_e8.content.disposer;
                    local_110 = local_d0;
                    local_128.content.ptr =
                         (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
                    str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                              (&local_e8,(kj *)0x229d2c,(char (*) [2])&local_c0," ",
                               (char (*) [2])(&local_c8->callback + (long)ppcVar6),
                               (StringPtr *)0x2026bc,(char (*) [3])&local_128.content.size_,
                               in_stack_fffffffffffffed0);
                    if ((char *)local_e8.content.size_ == (char *)0x0) {
                      local_e8.content.ptr = "";
                    }
                    message_13.content.size_ =
                         (char *)(local_e8.content.size_ +
                                 ((char *)local_e8.content.size_ == (char *)0x0));
                    programName_15.content.size_ = local_f8;
                    programName_15.content.ptr = local_100;
                    message_13.content.ptr = local_e8.content.ptr;
                    usageError(local_f0,programName_15,message_13);
                  }
                  local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
                  pAVar18 = local_b0;
                  if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
                     ((char *)local_e8.content.size_ != (char *)0x0)) {
                    local_e8.content.size_ = 0;
                    local_e8.content.disposer = (ArrayDisposer *)0x0;
                    pAVar27 = pAVar21;
                    (**(code **)*local_d0)(local_d0,sVar24,1);
                    pAVar17 = pAVar21;
                    pAVar18 = local_b0;
                  }
                  break;
                }
              }
              str<char_const(&)[2],char&,char_const(&)[19]>
                        (&local_128,(kj *)0x229d2c,(char (*) [2])&local_c0,": missing argument",
                         (char (*) [19])0x0);
              pcVar25 = local_128.content.ptr;
              if (local_128.content.size_ == 0) {
                pcVar25 = "";
              }
              message_09.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_11.content.size_ = local_f8;
              programName_11.content.ptr = local_100;
              message_09.content.ptr = pcVar25;
              usageError(local_f0,programName_11,message_09);
            }
            (**(code **)**(undefined8 **)(*(long *)(pcVar25 + 0x18) + 8))(&local_e8);
            pAVar18 = (Arg *)local_e8.content.disposer;
            sVar24 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ != (_)0x0) {
              local_128.content.size_ = local_e8.content.size_;
              local_128.content.disposer = local_e8.content.disposer;
              local_110 = local_d0;
              local_128.content.ptr =
                   (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
              str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                        (&local_e8,(kj *)0x229d2c,(char (*) [2])&local_c0,": ",
                         (char (*) [3])&local_128.content.size_,params_3);
              if ((char *)local_e8.content.size_ == (char *)0x0) {
                local_e8.content.ptr = "";
              }
              message_03.content.size_ =
                   (char *)(local_e8.content.size_ + ((char *)local_e8.content.size_ == (char *)0x0)
                           );
              programName_04.content.size_ = local_f8;
              programName_04.content.ptr = local_100;
              message_03.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_04,message_03);
            }
            local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
            if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
               ((char *)local_e8.content.size_ != (char *)0x0)) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              (**(code **)*local_d0)(local_d0,sVar24,1);
              pAVar27 = pAVar18;
            }
            pAVar17 = (Arg *)(ulong)((int)pAVar17 + 1);
            sVar24 = CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_);
            pAVar21 = (Arg *)(sVar24 - 1);
            pAVar18 = local_b0;
          } while (pAVar17 < pAVar21);
        }
      }
      else {
        pAVar21 = (Arg *)(sVar24 - 1);
        if ((Arg *)0x1 < pAVar21) goto LAB_001dec9f;
LAB_001ded99:
        pIVar20 = (local_f0->impl).ptr;
        if ((pIVar20->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          iVar15 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(pIVar20->subCommands)._M_t,&local_a8);
          pIVar20 = (this->impl).ptr;
          p_Var19 = &(pIVar20->subCommands)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar15._M_node != p_Var19) {
            (*(code *)**(undefined8 **)iVar15._M_node[1]._M_right)(&local_c0);
            local_e8.content.size_ = local_f8 - 1;
            local_e8.content.ptr = local_100;
            local_40.ptr = (char *)CONCAT71(local_40.ptr._1_7_,0x20);
            local_89._1_8_ = CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_);
            sStack_80 = CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) -
                        1;
            kj::_::
            concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                      (&local_128,(_ *)&local_e8,&local_40,(FixedArray<char,_1UL> *)(local_89 + 1),
                       (ArrayPtr<const_char> *)pAVar27);
            pcVar25 = local_128.content.ptr;
            if (local_128.content.size_ == 0) {
              pcVar25 = "";
            }
            ppcVar6 = &(pAVar23->title).content.ptr;
            (**(code **)*local_b8)
                      (local_b8,pcVar25,local_128.content.size_ + (local_128.content.size_ == 0),
                       &local_c8->callback + (long)ppcVar6,(long)pAVar18 - (long)((long)ppcVar6 + 1)
                      );
            sVar24 = local_128.content.size_;
            pcVar25 = local_128.content.ptr;
            if (local_128.content.ptr != (char *)0x0) {
              local_128.content.ptr = (char *)0x0;
              local_128.content.size_ = 0;
              (**(local_128.content.disposer)->_vptr_ArrayDisposer)
                        (local_128.content.disposer,pcVar25,1,sVar24,sVar24,0);
            }
            plVar8 = local_b8;
            if (local_b8 != (long *)0x0) {
              local_b8 = (long *)0x0;
              (*(code *)**(undefined8 **)CONCAT71(uStack_bf,local_c0))
                        ((undefined8 *)CONCAT71(uStack_bf,local_c0),
                         (long)plVar8 + *(long *)(*plVar8 + -0x10));
            }
            goto LAB_001df6c0;
          }
          if ((CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) != 5) ||
             (uVar30 = *(uint *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) ^
                       0x706c6568, p_Var19 = (_Rb_tree_header *)(ulong)uVar30,
             (char)((uint *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_))[1] !=
             '\0' || uVar30 != 0)) {
            str<kj::StringPtr&,char_const(&)[18]>
                      (&local_128,(kj *)&local_a8,(StringPtr *)": unknown command",
                       (char (*) [18])p_Var19);
            pcVar25 = local_128.content.ptr;
            if (local_128.content.size_ == 0) {
              pcVar25 = "";
            }
            message_16.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
            programName_19.content.size_ = local_f8;
            programName_19.content.ptr = local_100;
            message_16.content.ptr = pcVar25;
            usageError(local_f0,programName_19,message_16);
          }
          ppcVar6 = &(pAVar23->title).content.ptr;
          if (pAVar18 <= (Arg *)((long)ppcVar6 + 1U)) {
            programName_18.content.size_ = local_f8;
            programName_18.content.ptr = local_100;
            printHelp(this,programName_18);
          }
          this_01 = (kj *)(&local_c8->callback + (long)ppcVar6);
          iVar15 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(pIVar20->subCommands)._M_t,(key_type *)this_01);
          pIVar20 = (this->impl).ptr;
          if ((_Rb_tree_header *)iVar15._M_node ==
              &(pIVar20->subCommands)._M_t._M_impl.super__Rb_tree_header) {
            if ((*(long *)(this_01 + 8) != 5) ||
               ((char)(*(int **)this_01)[1] != '\0' || **(int **)this_01 != 0x706c6568)) {
              str<kj::StringPtr_const&,char_const(&)[18]>
                        (&local_128,this_01,(StringPtr *)": unknown command",(char (*) [18])pIVar20)
              ;
              pcVar25 = local_128.content.ptr;
              if (local_128.content.size_ == 0) {
                pcVar25 = "";
              }
              message_17.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_20.content.size_ = local_f8;
              programName_20.content.ptr = local_100;
              message_17.content.ptr = pcVar25;
              usageError(local_f0,programName_20,message_17);
            }
            pAVar27 = (Arg *)(ulong)((int)pAVar23 + 2);
            if (local_b0 <= pAVar27) goto LAB_001dff53;
            uVar30 = 0;
            goto LAB_001dfe6a;
          }
          (*(code *)**(undefined8 **)iVar15._M_node[1]._M_right)(&local_c0);
          local_40.ptr = "--help";
          local_40.size_ = 7;
          local_e8.content.size_ = local_f8 - 1;
          local_e8.content.ptr = local_100;
          local_89[0] = 0x20;
          local_89._1_8_ = *(undefined8 *)this_01;
          sStack_80 = *(long *)(this_01 + 8) - 1;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                    (&local_128,(_ *)&local_e8,(ArrayPtr<const_char> *)local_89,
                     (FixedArray<char,_1UL> *)(local_89 + 1),(ArrayPtr<const_char> *)pAVar27);
          pcVar25 = local_128.content.ptr;
          if (local_128.content.size_ == 0) {
            pcVar25 = "";
          }
          (**(code **)*local_b8)
                    (local_b8,pcVar25,local_128.content.size_ + (local_128.content.size_ == 0),
                     &local_40,1);
          sVar24 = local_128.content.size_;
          pcVar25 = local_128.content.ptr;
          if (local_128.content.ptr != (char *)0x0) {
            local_128.content.ptr = (char *)0x0;
            local_128.content.size_ = 0;
            (**(local_128.content.disposer)->_vptr_ArrayDisposer)
                      (local_128.content.disposer,pcVar25,1,sVar24,sVar24,0);
          }
          plVar8 = local_b8;
          if (local_b8 != (long *)0x0) {
            local_b8 = (long *)0x0;
            (*(code *)**(undefined8 **)CONCAT71(uStack_bf,local_c0))
                      ((undefined8 *)CONCAT71(uStack_bf,local_c0),
                       (long)plVar8 + *(long *)(*plVar8 + -0x10));
          }
          goto LAB_001df6c0;
        }
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar24 = (long)local_78.builder.pos - (long)local_78.builder.ptr >> 3;
          if (local_78.builder.pos == local_78.builder.ptr) {
            sVar24 = 4;
          }
          pAVar17 = (Arg *)local_78.builder.ptr;
          Vector<kj::StringPtr>::setCapacity(&local_78,sVar24);
        }
        *(undefined4 *)&((local_78.builder.pos)->content).ptr = local_a8.content.ptr._0_4_;
        *(undefined4 *)((long)&((local_78.builder.pos)->content).ptr + 4) =
             local_a8.content.ptr._4_4_;
        *(undefined4 *)&((local_78.builder.pos)->content).size_ = (undefined4)local_a8.content.size_
        ;
        *(undefined4 *)((long)&((local_78.builder.pos)->content).size_ + 4) =
             local_a8.content.size_._4_4_;
        local_78.builder.pos = (RemoveConst<kj::StringPtr> *)((long)local_78.builder.pos + 0x10);
      }
      pAVar23 = (Arg *)((long)&(pAVar23->title).content.ptr + 1);
    } while (pAVar23 < pAVar18);
  }
  pIVar20 = (this->impl).ptr;
  if ((pIVar20->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    programName_06.content.size_ = local_f8;
    programName_06.content.ptr = local_100;
    message_04.content.size_ = 0x10;
    message_04.content.ptr = "missing command";
    usageError(this,programName_06,message_04);
  }
  pAVar23 = (pIVar20->args).builder.ptr;
  pAVar18 = (pIVar20->args).builder.pos;
  pAVar21 = (Arg *)local_78.builder.ptr;
  if (pAVar23 != pAVar18) {
    uVar30 = 0;
    pAVar14 = pAVar23;
    do {
      uVar30 = uVar30 + pAVar14->minCount;
      pAVar14 = pAVar14 + 1;
    } while (pAVar14 != pAVar18);
    if (pAVar23 != pAVar18) {
      local_b0 = pAVar18;
      do {
        if (pAVar23->minCount == 0) {
          uVar29 = 0;
        }
        else {
          uVar29 = 0;
          do {
            if (pAVar21 == (Arg *)local_78.builder.pos) {
              str<char_const(&)[18],kj::StringPtr&>
                        (&local_128,(kj *)"missing argument ",(char (*) [18])pAVar23,&pAVar17->title
                        );
              pcVar25 = local_128.content.ptr;
              if (local_128.content.size_ == 0) {
                pcVar25 = "";
              }
              message_00.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_01.content.size_ = local_f8;
              programName_01.content.ptr = local_100;
              message_00.content.ptr = pcVar25;
              usageError(local_f0,programName_01,message_00);
            }
            pAVar17 = (Arg *)(pAVar21->title).content.size_;
            pIVar4 = (pAVar23->callback).impl.ptr;
            (**pIVar4->_vptr_Iface)(&local_e8,pIVar4,(pAVar21->title).content.ptr);
            pAVar18 = (Arg *)local_e8.content.disposer;
            sVar24 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ != (_)0x0) {
              local_128.content.size_ = local_e8.content.size_;
              local_128.content.disposer = local_e8.content.disposer;
              local_110 = local_d0;
              local_128.content.ptr =
                   (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        (&local_e8,(kj *)pAVar21,(StringPtr *)0x2026bc,
                         (char (*) [3])&local_128.content.size_,(String *)pAVar27);
              if ((char *)local_e8.content.size_ == (char *)0x0) {
                local_e8.content.ptr = "";
              }
              message.content.size_ =
                   (char *)(local_e8.content.size_ + ((char *)local_e8.content.size_ == (char *)0x0)
                           );
              programName_00.content.size_ = local_f8;
              programName_00.content.ptr = local_100;
              message.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_00,message);
            }
            local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
            if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
               ((char *)local_e8.content.size_ != (char *)0x0)) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              pAVar27 = pAVar18;
              (**(code **)*local_d0)(local_d0,sVar24,1,pAVar18,pAVar18,0);
              pAVar17 = pAVar18;
            }
            pAVar21 = (Arg *)&pAVar21->callback;
            uVar29 = uVar29 + 1;
          } while (uVar29 < pAVar23->minCount);
          uVar30 = uVar30 - uVar29;
        }
        local_c8 = (Arg *)CONCAT44(local_c8._4_4_,uVar30);
        if (uVar29 < pAVar23->maxCount) {
          lVar31 = -(long)pAVar21;
          do {
            if ((long)&((local_78.builder.pos)->content).ptr + lVar31 >> 4 <= (long)(ulong)uVar30)
            break;
            pAVar17 = (Arg *)(pAVar21->title).content.size_;
            pIVar4 = (pAVar23->callback).impl.ptr;
            (**pIVar4->_vptr_Iface)(&local_e8,pIVar4,(pAVar21->title).content.ptr);
            pAVar18 = (Arg *)local_e8.content.disposer;
            sVar24 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ != (_)0x0) {
              local_128.content.size_ = local_e8.content.size_;
              local_128.content.disposer = local_e8.content.disposer;
              local_110 = local_d0;
              local_128.content.ptr =
                   (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        (&local_e8,(kj *)pAVar21,(StringPtr *)0x2026bc,
                         (char (*) [3])&local_128.content.size_,(String *)pAVar27);
              if ((char *)local_e8.content.size_ == (char *)0x0) {
                local_e8.content.ptr = "";
              }
              message_02.content.size_ =
                   (char *)(local_e8.content.size_ + ((char *)local_e8.content.size_ == (char *)0x0)
                           );
              programName_03.content.size_ = local_f8;
              programName_03.content.ptr = local_100;
              message_02.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_03,message_02);
            }
            local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
            if ((local_e8.content.ptr._0_1_ != (_)0x0) &&
               ((char *)local_e8.content.size_ != (char *)0x0)) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              pAVar27 = pAVar18;
              (**(code **)*local_d0)(local_d0,sVar24,1);
              pAVar17 = pAVar18;
            }
            pAVar21 = (Arg *)&pAVar21->callback;
            uVar29 = uVar29 + 1;
            lVar31 = lVar31 + -0x10;
          } while (uVar29 < pAVar23->maxCount);
        }
        pAVar23 = pAVar23 + 1;
        uVar30 = (uint)local_c8;
      } while (pAVar23 != local_b0);
    }
  }
  this_00 = local_f0;
  if (pAVar21 < local_78.builder.pos) {
    str<kj::StringPtr&,char_const(&)[21]>
              (&local_128,(kj *)pAVar21,(StringPtr *)": too many arguments",(char (*) [21])pAVar17);
    pcVar25 = local_128.content.ptr;
    if (local_128.content.size_ == 0) {
      pcVar25 = "";
    }
    message_12.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
    programName_14.content.size_ = local_f8;
    programName_14.content.ptr = local_100;
    message_12.content.ptr = pcVar25;
    usageError(local_f0,programName_14,message_12);
  }
  pIVar20 = (local_f0->impl).ptr;
  if ((pIVar20->finalCallback).ptr.isSet == true) {
    (**((pIVar20->finalCallback).ptr.field_1.value.impl.ptr)->_vptr_Iface)(&local_e8);
    pAVar7 = local_e8.content.disposer;
    sVar24 = local_e8.content.size_;
    if (local_e8.content.ptr._0_1_ != (_)0x0) {
      local_128.content.size_ = local_e8.content.size_;
      local_128.content.disposer = local_e8.content.disposer;
      local_110 = local_d0;
      pcVar25 = "";
      if ((Arg *)local_e8.content.disposer != (Arg *)0x0) {
        pcVar25 = (char *)local_e8.content.size_;
      }
      local_128.content.ptr =
           (char *)CONCAT71(local_128.content.ptr._1_7_,local_e8.content.ptr._0_1_);
      message_06.content.size_ =
           (long)&((ArrayPtr<const_char> *)&(local_e8.content.disposer)->_vptr_ArrayDisposer)->ptr +
           (ulong)((Arg *)local_e8.content.disposer == (Arg *)0x0);
      programName_08.content.size_ = local_f8;
      programName_08.content.ptr = local_100;
      message_06.content.ptr = pcVar25;
      usageError(this_00,programName_08,message_06);
    }
    local_128.content.ptr = (char *)((ulong)local_128.content.ptr._1_7_ << 8);
    if ((local_e8.content.ptr._0_1_ != (_)0x0) && ((char *)local_e8.content.size_ != (char *)0x0)) {
      local_e8.content.size_ = 0;
      local_e8.content.disposer = (ArrayDisposer *)0x0;
      (**(code **)*local_d0)(local_d0,sVar24,1,pAVar7,pAVar7,0);
    }
  }
LAB_001df6c0:
  pSVar11 = local_78.builder.endPtr;
  pRVar10 = local_78.builder.pos;
  pSVar9 = local_78.builder.ptr;
  if ((Arg *)local_78.builder.ptr != (Arg *)0x0) {
    local_78.builder.ptr = (StringPtr *)0x0;
    local_78.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_78.builder.endPtr = (StringPtr *)0x0;
    (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
              (local_78.builder.disposer,pSVar9,0x10,(long)pRVar10 - (long)pSVar9 >> 4,
               (long)pSVar11 - (long)pSVar9 >> 4,0);
  }
  return;
  while( true ) {
    if (uVar29 != 0 || uVar28 != 0) break;
    pAVar27 = (Arg *)(ulong)((int)pAVar23 + 3 + uVar30);
    uVar30 = uVar30 + 1;
    if (local_b0 <= pAVar27) break;
LAB_001dfe6a:
    sVar24 = (&(local_c8->title).content)[(long)pAVar27].size_;
    if (sVar24 == 7) {
      puVar5 = (uint *)(&(local_c8->title).content)[(long)pAVar27].ptr;
      uVar28 = *puVar5 ^ 0x65682d2d;
      uVar29 = *(uint *)((long)puVar5 + 3) ^ 0x706c65;
    }
    else {
      if (sVar24 != 5) break;
      puVar5 = (uint *)(&(local_c8->title).content)[(long)pAVar27].ptr;
      uVar28 = *puVar5 ^ 0x706c6568;
      uVar29 = (uint)(byte)puVar5[1];
    }
  }
  if (uVar30 == 0) {
LAB_001dff53:
    pPVar26 = pIVar20->context;
    pIVar20 = (Impl *)(pPVar26->_vptr_ProcessContext + 5);
    uVar22 = 0x27;
    pcVar25 = "Help about help?  We must go deeper...";
  }
  else {
    if (uVar30 == 1) goto LAB_001dff6b;
    if (uVar30 == 2) {
      pPVar26 = pIVar20->context;
      pIVar20 = (Impl *)(pPVar26->_vptr_ProcessContext + 5);
      uVar22 = 0x2a;
      pcVar25 = "Help, I\'m trapped in a help text factory!";
    }
    else {
      pPVar26 = pIVar20->context;
      if (uVar30 < 10) {
        pIVar20 = (Impl *)(pPVar26->_vptr_ProcessContext + 4);
        uVar22 = 0x1f;
        pcVar25 = "Killed by signal 911 (SIGHELP)";
      }
      else {
        pIVar20 = (Impl *)(pPVar26->_vptr_ProcessContext + 5);
        uVar22 = 0x1d;
        pcVar25 = "How to keep an idiot busy...";
      }
    }
  }
  do {
    (*(code *)pIVar20->context)(pPVar26,pcVar25,uVar22);
LAB_001dff6b:
    pPVar26 = pIVar20->context;
    pIVar20 = (Impl *)(pPVar26->_vptr_ProcessContext + 5);
    uVar22 = 0x6d;
    pcVar25 = 
    "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
    ;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_SOME(pos, param.findFirst('=')) {
        name = param.slice(2, pos);
        maybeArg = param.slice(pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_SOME(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_SOME(error, (*option.funcWithArg)(arg).releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_SOME(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == kj::none) {
            KJ_IF_SOME(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }